

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void exprAnalyze(SrcList *pSrc,WhereClause *pWC,int idxTerm)

{
  u16 *puVar1;
  u32 *puVar2;
  u16 uVar3;
  int iVar4;
  Parse *pParse;
  sqlite3 *db;
  WhereMaskSet *pMaskSet;
  sqlite3 *db_00;
  ExprList_item *pEVar5;
  Table *pTVar6;
  Vdbe *pVVar7;
  bool bVar8;
  bool bVar9;
  char cVar10;
  u8 uVar11;
  char cVar12;
  byte bVar13;
  short sVar14;
  uint uVar15;
  uint uVar16;
  int iVar17;
  long lVar18;
  Bitmask BVar19;
  char *pcVar20;
  ExprList *pEVar21;
  Expr *pEVar22;
  Expr *pEVar23;
  WhereClause *pWC_00;
  WhereOrInfo *pWC_01;
  CollSeq *pCVar24;
  char *pcVar25;
  FuncDef *pFVar26;
  sqlite3_value *pVal;
  Expr *pRight;
  Expr *pEVar27;
  byte *pbVar28;
  Expr *pEVar29;
  short sVar30;
  int iVar31;
  long lVar32;
  Table *pTVar33;
  byte bVar34;
  u8 aff;
  ushort uVar35;
  ushort uVar36;
  int idxTerm_00;
  int idxTerm_01;
  int idxTerm_02;
  int idxTerm_03;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar37;
  undefined8 extraout_RDX_02;
  byte *pbVar38;
  ushort uVar39;
  WhereTerm *pWVar40;
  int iVar41;
  WhereTerm *pWVar42;
  ulong uVar43;
  int iVar44;
  char **ppcVar45;
  long lVar46;
  ulong uVar47;
  long lVar48;
  Parse *pPVar49;
  ulong uVar50;
  int iVar51;
  u8 *puVar52;
  char **ppcVar53;
  bool bVar54;
  Token sCollSeqName;
  ulong local_b8;
  int local_88;
  WhereTerm *local_50;
  int local_48;
  Token local_40;
  
  pParse = *(Parse **)pSrc;
  db = pParse->db;
  if (db->mallocFailed != '\0') {
    return;
  }
  pMaskSet = (WhereMaskSet *)pSrc->a[0].pSchema;
  pTVar33 = pSrc->a[0].pTab;
  iVar41 = (int)pWC;
  lVar18 = (long)iVar41;
  lVar46 = lVar18 * 0x38;
  ppcVar45 = &pTVar33->zName + lVar18 * 7;
  pEVar29 = (Expr *)(&pTVar33->zName)[lVar18 * 7];
  pEVar22 = pEVar29->pLeft;
  BVar19 = exprTableUsage(pMaskSet,pEVar22);
  bVar34 = pEVar29->op;
  if (bVar34 == 0x49) {
    ppcVar45[5] = (char *)0x0;
  }
  else {
    if (bVar34 == 0x48) {
      if ((pEVar29->flags & 0x800) == 0) {
        pcVar20 = (char *)exprListTableUsage(pMaskSet,(pEVar29->x).pList);
      }
      else {
        pcVar20 = (char *)exprSelectTableUsage(pMaskSet,(Select *)(pEVar29->x).pList);
      }
    }
    else {
      pcVar20 = (char *)exprTableUsage(pMaskSet,pEVar29->pRight);
    }
    ppcVar45[5] = pcVar20;
  }
  pEVar21 = (ExprList *)exprTableUsage(pMaskSet,pEVar29);
  if ((pEVar29->flags & 1) == 0) {
    uVar47 = 0;
  }
  else {
    if ((long)pMaskSet->n < 1) {
      uVar47 = 0;
    }
    else {
      uVar47 = 0;
      lVar48 = 0;
      do {
        if (pMaskSet->ix[lVar48] == (int)pEVar29->iRightJoinTable) {
          uVar47 = 1L << ((byte)lVar48 & 0x3f);
          break;
        }
        lVar48 = lVar48 + 1;
      } while (pMaskSet->n != lVar48);
    }
    pEVar21 = (ExprList *)((ulong)pEVar21 | uVar47);
    uVar47 = uVar47 - 1;
  }
  ppcVar45[6] = (char *)pEVar21;
  ppcVar45[1] = (char *)0xffffffffffffffff;
  *(undefined2 *)(ppcVar45 + 3) = 0;
  if ((bVar34 & 0xfe) == 0x48 || bVar34 - 0x4c < 5) {
    for (; (pEVar22 != (Expr *)0x0 && ((pEVar22->op == '\\' || (pEVar22->op == '\x18'))));
        pEVar22 = pEVar22->pLeft) {
    }
    for (pEVar23 = pEVar29->pRight;
        (pEVar23 != (Expr *)0x0 && ((pEVar23->op == '\\' || (pEVar23->op == '\x18'))));
        pEVar23 = pEVar23->pLeft) {
    }
    uVar39 = 0x400;
    if (((ulong)ppcVar45[5] & BVar19) == 0) {
      uVar39 = 0xfff;
    }
    if (pEVar22->op == 0x98) {
      *(int *)((long)ppcVar45 + 0xc) = pEVar22->iTable;
      *(int *)(ppcVar45 + 2) = (int)pEVar22->iColumn;
      if (bVar34 == 0x48) {
        uVar35 = 1;
      }
      else if (bVar34 == 0x49) {
        uVar35 = 0x80;
      }
      else {
        uVar35 = (ushort)(2 << ((byte)(bVar34 - 0x4c) & 0x1f));
      }
      *(ushort *)(ppcVar45 + 3) = uVar39 & uVar35;
    }
    bVar54 = true;
    if ((pEVar23 != (Expr *)0x0) && (pEVar23->op == 0x98)) {
      ppcVar53 = ppcVar45;
      if (*(int *)((long)ppcVar45 + 0xc) < 0) {
        sVar30 = 0;
        pEVar22 = pEVar29;
      }
      else {
        pEVar22 = exprDup(db,pEVar29,0,(u8 **)0x0);
        if (db->mallocFailed == '\0') {
          iVar17 = whereClauseInsert((WhereClause *)pSrc,pEVar22,'\x03');
          if (iVar17 == 0) goto LAB_0019743f;
          pTVar33 = pSrc->a[0].pTab;
          ppcVar45 = &pTVar33->zName + (long)iVar17 * 7;
          *(int *)(&pTVar33->aCol + (long)iVar17 * 7) = iVar41;
          *(undefined1 *)((long)&pTVar33->pSelect + lVar46 + 3) = 1;
          pbVar38 = (byte *)((long)&pTVar33->pSelect + lVar46 + 2);
          *pbVar38 = *pbVar38 | 8;
          ppcVar53 = &pTVar33->zName + lVar18 * 7;
          bVar54 = true;
          if (((pEVar29->op == 'L') && ((pEVar29->flags & 1) == 0)) &&
             ((db->dbOptFlags & 0x200) == 0)) {
            *(byte *)((long)ppcVar53 + 0x19) = *(byte *)((long)ppcVar53 + 0x19) | 4;
            sVar30 = 0x400;
          }
          else {
            sVar30 = 0;
          }
        }
        else {
          sqlite3ExprDelete(db,pEVar22);
LAB_0019743f:
          sVar30 = 0;
          bVar54 = false;
        }
        if (!bVar54) {
          bVar54 = false;
          ppcVar45 = ppcVar53;
          goto LAB_00197610;
        }
      }
      uVar35 = pEVar22->pRight->flags;
      uVar36 = uVar35 & 0x100;
      if (uVar36 == (pEVar22->pLeft->flags & 0x100)) {
        if (uVar36 == 0) {
          pCVar24 = sqlite3ExprCollSeq(pParse,pEVar22->pLeft);
          if (pCVar24 != (CollSeq *)0x0) {
            puVar1 = &pEVar22->pLeft->flags;
            *puVar1 = *puVar1 | 0x100;
          }
        }
        else {
          pEVar22->pRight->flags = uVar35 & 0xfeff;
        }
      }
      pEVar23 = pEVar22->pRight;
      pEVar22->pRight = pEVar22->pLeft;
      pEVar22->pLeft = pEVar23;
      if (0x4c < pEVar22->op) {
        pEVar22->op = (pEVar22->op + 0xb3 ^ 2) + 0x4d;
      }
      for (; (pEVar23 != (Expr *)0x0 && ((pEVar23->op == '\\' || (pEVar23->op == '\x18'))));
          pEVar23 = pEVar23->pLeft) {
      }
      *(int *)((long)ppcVar45 + 0xc) = pEVar23->iTable;
      *(int *)(ppcVar45 + 2) = (int)pEVar23->iColumn;
      ppcVar45[5] = (char *)(BVar19 | uVar47);
      ppcVar45[6] = (char *)pEVar21;
      uVar11 = pEVar22->op;
      if (uVar11 == 'H') {
        sVar14 = 1;
      }
      else if (uVar11 == 'I') {
        sVar14 = 0x80;
      }
      else {
        sVar14 = (short)(2 << (uVar11 + 0xb4 & 0x1f));
      }
      bVar54 = true;
      *(ushort *)(ppcVar45 + 3) = uVar39 & sVar30 + sVar14;
      ppcVar45 = ppcVar53;
    }
LAB_00197610:
    if (!bVar54) {
      return;
    }
  }
  else if (bVar34 == 0x44) {
    pWC_00 = (WhereClause *)sqlite3DbMallocRaw(db,0x1f8);
    if (pWC_00 == (WhereClause *)0x0) {
      ppcVar45[2] = (char *)0x0;
    }
    else {
      memset(pWC_00,0,0x1f8);
      ppcVar45[2] = (char *)pWC_00;
      *(byte *)((long)ppcVar45 + 0x1a) = *(byte *)((long)ppcVar45 + 0x1a) | 0x10;
      uVar3 = *(u16 *)((long)&pSrc->a[0].zName + 2);
      pWC_00->pParse = *(Parse **)pSrc;
      pWC_00->pMaskSet = pMaskSet;
      pWC_00->pOuter = (WhereClause *)0x0;
      pWC_00->nTerm = 0;
      pWC_00->nSlot = 8;
      pWC_00->a = pWC_00->aStatic;
      pWC_00->wctrlFlags = uVar3;
      whereSplit(pWC_00,pEVar29,0x44);
      if (0 < pWC_00->nTerm) {
        iVar17 = pWC_00->nTerm + 1;
        uVar37 = extraout_RDX;
        do {
          exprAnalyze((SrcList *)pWC_00,(WhereClause *)(ulong)(iVar17 - 2),(int)uVar37);
          iVar17 = iVar17 + -1;
          uVar37 = extraout_RDX_00;
        } while (1 < iVar17);
      }
      if (db->mallocFailed == '\0') {
        iVar17 = pWC_00->nTerm;
        if (iVar17 < 1) {
          pPVar49 = (Parse *)0xffffffffffffffff;
          local_b8 = 0xffffffffffffffff;
        }
        else {
          pWVar40 = pWC_00->a;
          local_b8 = 0xffffffffffffffff;
          pPVar49 = (Parse *)0xffffffffffffffff;
          do {
            bVar34 = (byte)pWVar40->eOperator;
            if (bVar34 == 0) {
              pWC_01 = (WhereOrInfo *)sqlite3DbMallocRaw(db,0x1f0);
              if (pWC_01 == (WhereOrInfo *)0x0) {
                local_b8 = 0;
              }
              else {
                (pWVar40->u).pOrInfo = pWC_01;
                pWVar40->wtFlags = pWVar40->wtFlags | 0x20;
                pWVar40->eOperator = 0x200;
                uVar3 = *(u16 *)((long)&pSrc->a[0].zName + 2);
                (pWC_01->wc).pParse = *(Parse **)pSrc;
                (pWC_01->wc).pMaskSet = pMaskSet;
                (pWC_01->wc).pOuter = (WhereClause *)0x0;
                (pWC_01->wc).nTerm = 0;
                (pWC_01->wc).nSlot = 8;
                (pWC_01->wc).a = (pWC_01->wc).aStatic;
                (pWC_01->wc).wctrlFlags = uVar3;
                whereSplit((WhereClause *)pWC_01,pWVar40->pExpr,0x45);
                iVar31 = (pWC_01->wc).nTerm;
                if (0 < iVar31) {
                  iVar31 = iVar31 + 1;
                  uVar37 = extraout_RDX_01;
                  do {
                    exprAnalyze((SrcList *)pWC_01,(WhereClause *)(ulong)(iVar31 - 2),(int)uVar37);
                    iVar31 = iVar31 + -1;
                    uVar37 = extraout_RDX_02;
                  } while (1 < iVar31);
                }
                (pWC_01->wc).pOuter = (WhereClause *)pSrc;
                if ((db->mallocFailed == '\0') && (iVar31 = (pWC_01->wc).nTerm, 0 < iVar31)) {
                  pWVar42 = (pWC_01->wc).a;
                  uVar50 = 0;
                  iVar44 = 0;
                  do {
                    bVar34 = pWVar42->pExpr->op;
                    if ((bVar34 & 0xfe) == 0x48 || 0xfffffffa < bVar34 - 0x51) {
                      if (0 < (long)pMaskSet->n) {
                        lVar48 = 0;
                        do {
                          if (pMaskSet->ix[lVar48] == pWVar42->leftCursor) {
                            uVar43 = 1L << ((byte)lVar48 & 0x3f);
                            goto LAB_00197374;
                          }
                          lVar48 = lVar48 + 1;
                        } while (pMaskSet->n != lVar48);
                      }
                      uVar43 = 0;
LAB_00197374:
                      uVar50 = uVar50 | uVar43;
                    }
                    iVar44 = iVar44 + 1;
                    pWVar42 = pWVar42 + 1;
                  } while (iVar44 != iVar31);
                }
                else {
                  uVar50 = 0;
                }
                pPVar49 = (Parse *)((ulong)pPVar49 & uVar50);
                local_b8 = 0;
              }
            }
            else if ((pWVar40->wtFlags & 8) == 0) {
              lVar48 = (long)pMaskSet->n;
              if (0 < lVar48) {
                lVar32 = 0;
                do {
                  if (pMaskSet->ix[lVar32] == pWVar40->leftCursor) {
                    uVar50 = 1L << ((byte)lVar32 & 0x3f);
                    goto LAB_001972c7;
                  }
                  lVar32 = lVar32 + 1;
                } while (lVar48 != lVar32);
              }
              uVar50 = 0;
LAB_001972c7:
              if ((pWVar40->wtFlags & 2) != 0) {
                if (0 < pMaskSet->n) {
                  lVar32 = 0;
                  do {
                    if (pMaskSet->ix[lVar32] == pWC_00->a[pWVar40->iParent].leftCursor) {
                      uVar43 = 1L << ((byte)lVar32 & 0x3f);
                      goto LAB_00197398;
                    }
                    lVar32 = lVar32 + 1;
                  } while (lVar48 != lVar32);
                }
                uVar43 = 0;
LAB_00197398:
                uVar50 = uVar50 | uVar43;
              }
              pPVar49 = (Parse *)((ulong)pPVar49 & uVar50);
              local_b8 = local_b8 & uVar50;
              if ((bVar34 & 2) == 0) {
                local_b8 = 0;
              }
            }
            if (iVar17 < 2) break;
            iVar17 = iVar17 + -1;
            pWVar40 = pWVar40 + 1;
          } while (pPVar49 != (Parse *)0x0);
        }
        pWC_00[1].pParse = pPVar49;
        *(ushort *)(ppcVar45 + 3) = (ushort)(pPVar49 != (Parse *)0x0) << 8;
        if (local_b8 != 0) {
          local_50 = pWC_00->a;
          local_48 = pWC_00->nTerm;
          local_88 = local_48 + -1;
          iVar44 = -1;
          iVar31 = 0;
          bVar54 = true;
          iVar17 = -1;
          do {
            pWVar40 = local_50;
            iVar51 = local_88;
            if (local_48 < 1) {
              bVar8 = true;
            }
            else {
              do {
                pWVar40->wtFlags = pWVar40->wtFlags & 0xbf;
                iVar4 = pWVar40->leftCursor;
                if (iVar4 != iVar44) {
                  if (0 < (long)pMaskSet->n) {
                    lVar48 = 0;
                    do {
                      if (pMaskSet->ix[lVar48] == iVar4) {
                        uVar50 = 1L << ((byte)lVar48 & 0x3f);
                        goto LAB_00197bcc;
                      }
                      lVar48 = lVar48 + 1;
                    } while (pMaskSet->n != lVar48);
                  }
                  uVar50 = 0;
LAB_00197bcc:
                  if ((local_b8 & uVar50) != 0) {
                    iVar17 = (pWVar40->u).leftColumn;
                    bVar8 = false;
                    iVar44 = iVar4;
                    goto LAB_00197c05;
                  }
                }
                pWVar40 = pWVar40 + 1;
                bVar8 = 0 < iVar51;
                iVar51 = iVar51 + -1;
              } while (bVar8);
              bVar8 = true;
              iVar51 = -1;
            }
LAB_00197c05:
            if (bVar8) break;
            if (iVar51 < 0) {
              bVar8 = true;
            }
            else {
              puVar52 = &pWVar40->wtFlags;
              do {
                if (*(int *)(puVar52 + -0xe) == iVar44) {
                  bVar54 = false;
                  bVar8 = false;
                  if (((anon_union_8_3_737c4e49_for_u *)(puVar52 + -10))->leftColumn == iVar17) {
                    pEVar22 = ((WhereTerm *)(puVar52 + -0x1a))->pExpr;
                    cVar10 = sqlite3ExprAffinity(pEVar22->pRight);
                    cVar12 = sqlite3ExprAffinity(pEVar22->pLeft);
                    if (cVar10 != '\0') {
                      bVar54 = false;
                      bVar8 = false;
                      if (cVar10 != cVar12) goto LAB_00197c67;
                    }
                    *puVar52 = *puVar52 | 0x40;
                    goto LAB_00197c60;
                  }
                }
                else {
                  *puVar52 = *puVar52 & 0xbf;
LAB_00197c60:
                  bVar8 = true;
                  bVar54 = true;
                }
LAB_00197c67:
                if (!bVar54) break;
                puVar52 = puVar52 + 0x38;
                bVar54 = 0 < iVar51;
                iVar51 = iVar51 + -1;
              } while (bVar54);
            }
            bVar54 = !bVar8;
            bVar9 = iVar31 == 0;
            iVar31 = iVar31 + 1;
          } while (!bVar8 && bVar9);
          if (!bVar54) {
            if (pWC_00->nTerm < 1) {
              pEVar21 = (ExprList *)0x0;
              pEVar22 = (Expr *)0x0;
            }
            else {
              pWVar40 = pWC_00->a;
              iVar17 = pWC_00->nTerm + 1;
              pEVar22 = (Expr *)0x0;
              pEVar21 = (ExprList *)0x0;
              do {
                if ((pWVar40->wtFlags & 0x40) != 0) {
                  pEVar22 = exprDup(db,pWVar40->pExpr->pRight,0,(u8 **)0x0);
                  pEVar21 = sqlite3ExprListAppend(*(Parse **)pSrc,pEVar21,pEVar22);
                  pEVar22 = pWVar40->pExpr->pLeft;
                }
                pWVar40 = pWVar40 + 1;
                iVar17 = iVar17 + -1;
              } while (1 < iVar17);
            }
            pEVar22 = exprDup(db,pEVar22,0,(u8 **)0x0);
            pEVar22 = sqlite3PExpr(pParse,0x48,pEVar22,(Expr *)0x0,(Token *)0x0);
            if (pEVar22 == (Expr *)0x0) {
              sqlite3ExprListDelete(db,pEVar21);
            }
            else {
              pEVar22->flags = pEVar22->flags | pEVar29->flags & 1;
              pEVar22->iRightJoinTable = pEVar29->iRightJoinTable;
              (pEVar22->x).pList = pEVar21;
              uVar15 = whereClauseInsert((WhereClause *)pSrc,pEVar22,'\x03');
              exprAnalyze(pSrc,(WhereClause *)(ulong)uVar15,idxTerm_03);
              pTVar33 = pSrc->a[0].pTab;
              *(int *)(&pTVar33->aCol + (long)(int)uVar15 * 7) = iVar41;
              *(undefined1 *)((long)&pTVar33->pSelect + lVar46 + 3) = 1;
            }
            *(undefined2 *)(&pTVar33->pSelect + lVar18 * 7) = 0x800;
          }
        }
      }
    }
    ppcVar45 = &(pSrc->a[0].pTab)->zName + lVar18 * 7;
  }
  else if ((bVar34 == 0x47) && (*(char *)&pSrc->a[0].zName == 'E')) {
    pEVar21 = (pEVar29->x).pList;
    puVar52 = "PN";
    lVar48 = 0;
    do {
      bVar34 = *puVar52;
      pEVar22 = exprDup(db,pEVar29->pLeft,0,(u8 **)0x0);
      pEVar23 = exprDup(db,*(Expr **)((long)&pEVar21->a->pExpr + lVar48),0,(u8 **)0x0);
      pEVar22 = sqlite3PExpr(pParse,(uint)bVar34,pEVar22,pEVar23,(Token *)0x0);
      uVar15 = whereClauseInsert((WhereClause *)pSrc,pEVar22,'\x03');
      exprAnalyze(pSrc,(WhereClause *)(ulong)uVar15,idxTerm_00);
      pTVar33 = pSrc->a[0].pTab;
      *(int *)(&pTVar33->aCol + (long)(int)uVar15 * 7) = iVar41;
      lVar48 = lVar48 + 0x20;
      puVar52 = puVar52 + 1;
    } while (lVar48 == 0x20);
    *(undefined1 *)((long)&pTVar33->pSelect + lVar46 + 3) = 2;
    ppcVar45 = &pTVar33->zName + lVar18 * 7;
  }
  if (*(char *)&pSrc->a[0].zName != 'E') goto LAB_0019798d;
  db_00 = pParse->db;
  bVar8 = true;
  bVar34 = 1;
  bVar54 = true;
  if (pEVar29->op == 0x97) {
    if ((pEVar29->x).pList == (ExprList *)0x0) {
      bVar54 = true;
    }
    else {
      bVar54 = true;
      if (((pEVar29->x).pList)->nExpr == 2) {
        pcVar20 = (pEVar29->u).zToken;
        if (pcVar20 == (char *)0x0) {
          uVar15 = 0;
        }
        else {
          uVar15 = 0xffffffff;
          pcVar25 = pcVar20;
          do {
            uVar15 = uVar15 + 1;
            cVar10 = *pcVar25;
            pcVar25 = pcVar25 + 1;
          } while (cVar10 != '\0');
          uVar15 = uVar15 & 0x3fffffff;
        }
        pFVar26 = sqlite3FindFunction(db_00,pcVar20,uVar15,2,'\x01','\0');
        if (pFVar26 == (FuncDef *)0x0) {
          bVar54 = true;
          bVar34 = 1;
        }
        else {
          bVar54 = true;
          bVar34 = 1;
          if ((pFVar26->flags & 1) != 0) {
            pcVar20 = (char *)pFVar26->pUserData;
            local_50._0_1_ = *pcVar20;
            local_88._0_1_ = pcVar20[1];
            local_48._0_1_ = pcVar20[2];
            bVar34 = (pFVar26->flags & 2) >> 1;
            bVar54 = false;
          }
        }
      }
    }
  }
  if (bVar54) {
    pEVar22 = (Expr *)0x0;
    bVar54 = false;
  }
  else {
    pEVar5 = ((pEVar29->x).pList)->a;
    pEVar22 = pEVar5[1].pExpr;
    if (((pEVar22->op == 0x98) && (cVar10 = sqlite3ExprAffinity(pEVar22), cVar10 == 'a')) &&
       ((pEVar22->pTab->tabFlags & 0x10) == 0)) {
      pEVar23 = pEVar5->pExpr;
      uVar11 = pEVar23->op;
      if (uVar11 == 0x84) {
        uVar11 = pEVar23->op2;
      }
      if (uVar11 == 0x85) {
        sVar30 = pEVar23->iColumn;
        pVal = sqlite3VdbeGetValue(pParse->pReprepare,(int)sVar30,aff);
        if ((pVal == (sqlite3_value *)0x0) || (pVal->type != '\x03')) {
          pcVar20 = (char *)0x0;
        }
        else {
          pcVar20 = (char *)sqlite3ValueText(pVal,'\x01');
        }
        if (sVar30 < 0x21) {
          puVar2 = &pParse->pVdbe->expmask;
          *puVar2 = *puVar2 | 1 << ((char)sVar30 - 1U & 0x1f);
        }
        else {
          pParse->pVdbe->expmask = 0xffffffff;
        }
      }
      else {
        if (uVar11 == '^') {
          pcVar20 = (pEVar23->u).zToken;
        }
        else {
          pcVar20 = (char *)0x0;
        }
        pVal = (sqlite3_value *)0x0;
      }
      bVar8 = true;
      if (pcVar20 == (char *)0x0) {
LAB_00197e4e:
        pEVar22 = (Expr *)0x0;
        bVar54 = false;
      }
      else {
        lVar48 = -0x200000000;
        uVar50 = 0;
        while( true ) {
          uVar43 = uVar50;
          lVar48 = lVar48 + 0x100000000;
          cVar10 = pcVar20[uVar43];
          uVar50 = uVar43 + 1;
          if ((cVar10 == '\0') || (cVar10 == (char)local_50)) break;
          if ((cVar10 == (char)local_88) || (cVar10 == (char)local_48)) break;
        }
        if ((uVar50 == 1) || (pcVar20[lVar48 >> 0x20] == -1)) goto LAB_00197e4e;
        bVar54 = false;
        if (cVar10 == (char)local_50) {
          bVar54 = pcVar20[uVar50 & 0xffffffff] == '\0';
        }
        pEVar22 = sqlite3Expr(db_00,0x5e,pcVar20);
        if (pEVar22 != (Expr *)0x0) {
          (pEVar22->u).zToken[uVar43] = '\0';
        }
        if (uVar11 == 0x85) {
          pVVar7 = pParse->pVdbe;
          if (pEVar23->iColumn < 0x21) {
            pVVar7->expmask = pVVar7->expmask | 1 << ((char)pEVar23->iColumn - 1U & 0x1f);
          }
          else {
            pVVar7->expmask = 0xffffffff;
          }
          if ((!bVar54) || ((pEVar23->u).zToken[1] == '\0')) goto LAB_00197f77;
          if (pParse->nTempReg == '\0') {
            iVar17 = pParse->nMem + 1;
            pParse->nMem = iVar17;
          }
          else {
            bVar13 = pParse->nTempReg - 1;
            pParse->nTempReg = bVar13;
            iVar17 = pParse->aTempReg[bVar13];
          }
          sqlite3ExprCodeTarget(pParse,pEVar23,iVar17);
          if (pVVar7->nOp != 0) {
            pVVar7->aOp[pVVar7->nOp - 1].p3 = 0;
          }
          if (iVar17 != 0) {
            bVar13 = pParse->nTempReg;
            if ((ulong)bVar13 < 8) {
              lVar48 = 0;
              do {
                if (*(int *)((long)&pParse->aColCache[0].iReg + lVar48) == iVar17) {
                  (&pParse->aColCache[0].tempReg)[lVar48] = '\x01';
                  goto LAB_00197fec;
                }
                lVar48 = lVar48 + 0x18;
              } while ((int)lVar48 != 0xf0);
              pParse->nTempReg = bVar13 + 1;
              pParse->aTempReg[bVar13] = iVar17;
            }
          }
LAB_00197fec:
          bVar8 = false;
        }
        else {
LAB_00197f77:
          bVar8 = false;
        }
      }
      sqlite3ValueFree(pVal);
    }
    else {
      pEVar22 = (Expr *)0x0;
      bVar54 = false;
    }
  }
  if (!bVar8) {
    pEVar23 = ((pEVar29->x).pList)->a[1].pExpr;
    pRight = exprDup(db,pEVar22,0,(u8 **)0x0);
    if (db->mallocFailed == '\0') {
      pcVar20 = (pRight->u).zToken;
      if (pcVar20 == (char *)0x0) {
        uVar50 = 0;
      }
      else {
        lVar48 = -1;
        do {
          lVar32 = lVar48 + 1;
          lVar48 = lVar48 + 1;
        } while (pcVar20[lVar32] != '\0');
        uVar50 = (ulong)((uint)lVar48 & 0x3fffffff);
      }
      bVar13 = pcVar20[uVar50 - 1];
      if (bVar34 == 0) {
        if (bVar13 == 0x40) {
          bVar54 = false;
        }
        bVar13 = ""[bVar13];
      }
      pcVar20[uVar50 - 1] = bVar13 + 1;
    }
    local_40.z = "NOCASE";
    if (bVar34 != 0) {
      local_40.z = "BINARY";
    }
    local_40.n = 6;
    pEVar27 = exprDup(db,pEVar23,0,(u8 **)0x0);
    pEVar27 = sqlite3ExprAddCollateToken(pParse,pEVar27,&local_40);
    pEVar22 = sqlite3PExpr(pParse,0x50,pEVar27,pEVar22,(Token *)0x0);
    uVar15 = whereClauseInsert((WhereClause *)pSrc,pEVar22,'\x03');
    exprAnalyze(pSrc,(WhereClause *)(ulong)uVar15,idxTerm_01);
    pEVar22 = exprDup(db,pEVar23,0,(u8 **)0x0);
    pEVar22 = sqlite3ExprAddCollateToken(pParse,pEVar22,&local_40);
    pEVar22 = sqlite3PExpr(pParse,0x4f,pEVar22,pRight,(Token *)0x0);
    uVar16 = whereClauseInsert((WhereClause *)pSrc,pEVar22,'\x03');
    exprAnalyze(pSrc,(WhereClause *)(ulong)uVar16,idxTerm_02);
    pTVar33 = pSrc->a[0].pTab;
    ppcVar45 = &pTVar33->zName + lVar18 * 7;
    if (bVar54) {
      *(int *)(&pTVar33->aCol + (long)(int)uVar15 * 7) = iVar41;
      *(int *)(&pTVar33->aCol + (long)(int)uVar16 * 7) = iVar41;
      *(undefined1 *)((long)ppcVar45 + 0x1b) = 2;
    }
  }
LAB_0019798d:
  if (pEVar29->op == 0x97) {
    pbVar38 = (byte *)(pEVar29->u).zToken;
    bVar34 = *pbVar38;
    if (bVar34 == 0) {
      pbVar28 = (byte *)0x1a6865;
    }
    else {
      pbVar28 = (byte *)0x1a6865;
      do {
        pbVar38 = pbVar38 + 1;
        if (""[bVar34] != ""[*pbVar28]) break;
        pbVar28 = pbVar28 + 1;
        bVar34 = *pbVar38;
      } while (bVar34 != 0);
    }
    if (((""[bVar34] == ""[*pbVar28]) && (((pEVar29->x).pList)->nExpr == 2)) &&
       ((((pEVar29->x).pList)->a[1].pExpr)->op == 0x98)) {
      pEVar5 = ((pEVar29->x).pList)->a;
      pEVar29 = pEVar5->pExpr;
      pEVar22 = pEVar5[1].pExpr;
      pcVar20 = (char *)exprTableUsage(pMaskSet,pEVar29);
      BVar19 = exprTableUsage(pMaskSet,pEVar22);
      if ((BVar19 & (ulong)pcVar20) == 0) {
        pEVar29 = exprDup(db,pEVar29,0,(u8 **)0x0);
        pEVar29 = sqlite3PExpr(pParse,0x32,(Expr *)0x0,pEVar29,(Token *)0x0);
        iVar17 = whereClauseInsert((WhereClause *)pSrc,pEVar29,'\x03');
        pTVar33 = pSrc->a[0].pTab;
        lVar48 = (long)iVar17;
        (&pTVar33->zColAff)[lVar48 * 7] = pcVar20;
        *(int *)((long)&pTVar33->aCol + lVar48 * 0x38 + 4) = pEVar22->iTable;
        *(int *)(&pTVar33->pIndex + lVar48 * 7) = (int)pEVar22->iColumn;
        *(undefined2 *)(&pTVar33->pSelect + lVar48 * 7) = 0x40;
        *(int *)(&pTVar33->aCol + lVar48 * 7) = iVar41;
        pTVar6 = pSrc->a[0].pTab;
        *(undefined1 *)((long)&pTVar6->pSelect + lVar46 + 3) = 1;
        pbVar38 = (byte *)((long)&pTVar6->pSelect + lVar46 + 2);
        *pbVar38 = *pbVar38 | 8;
        ppcVar45 = &pTVar6->zName + lVar18 * 7;
        (&pTVar33->pCheck)[lVar48 * 7] = (&pTVar6->pCheck)[lVar18 * 7];
      }
    }
  }
  ppcVar45[5] = (char *)((ulong)ppcVar45[5] | uVar47);
  return;
}

Assistant:

static void exprAnalyze(
  SrcList *pSrc,            /* the FROM clause */
  WhereClause *pWC,         /* the WHERE clause */
  int idxTerm               /* Index of the term to be analyzed */
){
  WhereTerm *pTerm;                /* The term to be analyzed */
  WhereMaskSet *pMaskSet;          /* Set of table index masks */
  Expr *pExpr;                     /* The expression to be analyzed */
  Bitmask prereqLeft;              /* Prerequesites of the pExpr->pLeft */
  Bitmask prereqAll;               /* Prerequesites of pExpr */
  Bitmask extraRight = 0;          /* Extra dependencies on LEFT JOIN */
  Expr *pStr1 = 0;                 /* RHS of LIKE/GLOB operator */
  int isComplete = 0;              /* RHS of LIKE/GLOB ends with wildcard */
  int noCase = 0;                  /* LIKE/GLOB distinguishes case */
  int op;                          /* Top-level operator.  pExpr->op */
  Parse *pParse = pWC->pParse;     /* Parsing context */
  sqlite3 *db = pParse->db;        /* Database connection */

  if( db->mallocFailed ){
    return;
  }
  pTerm = &pWC->a[idxTerm];
  pMaskSet = pWC->pMaskSet;
  pExpr = pTerm->pExpr;
  assert( pExpr->op!=TK_AS && pExpr->op!=TK_COLLATE );
  prereqLeft = exprTableUsage(pMaskSet, pExpr->pLeft);
  op = pExpr->op;
  if( op==TK_IN ){
    assert( pExpr->pRight==0 );
    if( ExprHasProperty(pExpr, EP_xIsSelect) ){
      pTerm->prereqRight = exprSelectTableUsage(pMaskSet, pExpr->x.pSelect);
    }else{
      pTerm->prereqRight = exprListTableUsage(pMaskSet, pExpr->x.pList);
    }
  }else if( op==TK_ISNULL ){
    pTerm->prereqRight = 0;
  }else{
    pTerm->prereqRight = exprTableUsage(pMaskSet, pExpr->pRight);
  }
  prereqAll = exprTableUsage(pMaskSet, pExpr);
  if( ExprHasProperty(pExpr, EP_FromJoin) ){
    Bitmask x = getMask(pMaskSet, pExpr->iRightJoinTable);
    prereqAll |= x;
    extraRight = x-1;  /* ON clause terms may not be used with an index
                       ** on left table of a LEFT JOIN.  Ticket #3015 */
  }
  pTerm->prereqAll = prereqAll;
  pTerm->leftCursor = -1;
  pTerm->iParent = -1;
  pTerm->eOperator = 0;
  if( allowedOp(op) ){
    Expr *pLeft = sqlite3ExprSkipCollate(pExpr->pLeft);
    Expr *pRight = sqlite3ExprSkipCollate(pExpr->pRight);
    u16 opMask = (pTerm->prereqRight & prereqLeft)==0 ? WO_ALL : WO_EQUIV;
    if( pLeft->op==TK_COLUMN ){
      pTerm->leftCursor = pLeft->iTable;
      pTerm->u.leftColumn = pLeft->iColumn;
      pTerm->eOperator = operatorMask(op) & opMask;
    }
    if( pRight && pRight->op==TK_COLUMN ){
      WhereTerm *pNew;
      Expr *pDup;
      u16 eExtraOp = 0;        /* Extra bits for pNew->eOperator */
      if( pTerm->leftCursor>=0 ){
        int idxNew;
        pDup = sqlite3ExprDup(db, pExpr, 0);
        if( db->mallocFailed ){
          sqlite3ExprDelete(db, pDup);
          return;
        }
        idxNew = whereClauseInsert(pWC, pDup, TERM_VIRTUAL|TERM_DYNAMIC);
        if( idxNew==0 ) return;
        pNew = &pWC->a[idxNew];
        pNew->iParent = idxTerm;
        pTerm = &pWC->a[idxTerm];
        pTerm->nChild = 1;
        pTerm->wtFlags |= TERM_COPIED;
        if( pExpr->op==TK_EQ
         && !ExprHasProperty(pExpr, EP_FromJoin)
         && OptimizationEnabled(db, SQLITE_Transitive)
        ){
          pTerm->eOperator |= WO_EQUIV;
          eExtraOp = WO_EQUIV;
        }
      }else{
        pDup = pExpr;
        pNew = pTerm;
      }
      exprCommute(pParse, pDup);
      pLeft = sqlite3ExprSkipCollate(pDup->pLeft);
      pNew->leftCursor = pLeft->iTable;
      pNew->u.leftColumn = pLeft->iColumn;
      testcase( (prereqLeft | extraRight) != prereqLeft );
      pNew->prereqRight = prereqLeft | extraRight;
      pNew->prereqAll = prereqAll;
      pNew->eOperator = (operatorMask(pDup->op) + eExtraOp) & opMask;
    }
  }

#ifndef SQLITE_OMIT_BETWEEN_OPTIMIZATION
  /* If a term is the BETWEEN operator, create two new virtual terms
  ** that define the range that the BETWEEN implements.  For example:
  **
  **      a BETWEEN b AND c
  **
  ** is converted into:
  **
  **      (a BETWEEN b AND c) AND (a>=b) AND (a<=c)
  **
  ** The two new terms are added onto the end of the WhereClause object.
  ** The new terms are "dynamic" and are children of the original BETWEEN
  ** term.  That means that if the BETWEEN term is coded, the children are
  ** skipped.  Or, if the children are satisfied by an index, the original
  ** BETWEEN term is skipped.
  */
  else if( pExpr->op==TK_BETWEEN && pWC->op==TK_AND ){
    ExprList *pList = pExpr->x.pList;
    int i;
    static const u8 ops[] = {TK_GE, TK_LE};
    assert( pList!=0 );
    assert( pList->nExpr==2 );
    for(i=0; i<2; i++){
      Expr *pNewExpr;
      int idxNew;
      pNewExpr = sqlite3PExpr(pParse, ops[i], 
                             sqlite3ExprDup(db, pExpr->pLeft, 0),
                             sqlite3ExprDup(db, pList->a[i].pExpr, 0), 0);
      idxNew = whereClauseInsert(pWC, pNewExpr, TERM_VIRTUAL|TERM_DYNAMIC);
      testcase( idxNew==0 );
      exprAnalyze(pSrc, pWC, idxNew);
      pTerm = &pWC->a[idxTerm];
      pWC->a[idxNew].iParent = idxTerm;
    }
    pTerm->nChild = 2;
  }
#endif /* SQLITE_OMIT_BETWEEN_OPTIMIZATION */

#if !defined(SQLITE_OMIT_OR_OPTIMIZATION) && !defined(SQLITE_OMIT_SUBQUERY)
  /* Analyze a term that is composed of two or more subterms connected by
  ** an OR operator.
  */
  else if( pExpr->op==TK_OR ){
    assert( pWC->op==TK_AND );
    exprAnalyzeOrTerm(pSrc, pWC, idxTerm);
    pTerm = &pWC->a[idxTerm];
  }
#endif /* SQLITE_OMIT_OR_OPTIMIZATION */

#ifndef SQLITE_OMIT_LIKE_OPTIMIZATION
  /* Add constraints to reduce the search space on a LIKE or GLOB
  ** operator.
  **
  ** A like pattern of the form "x LIKE 'abc%'" is changed into constraints
  **
  **          x>='abc' AND x<'abd' AND x LIKE 'abc%'
  **
  ** The last character of the prefix "abc" is incremented to form the
  ** termination condition "abd".
  */
  if( pWC->op==TK_AND 
   && isLikeOrGlob(pParse, pExpr, &pStr1, &isComplete, &noCase)
  ){
    Expr *pLeft;       /* LHS of LIKE/GLOB operator */
    Expr *pStr2;       /* Copy of pStr1 - RHS of LIKE/GLOB operator */
    Expr *pNewExpr1;
    Expr *pNewExpr2;
    int idxNew1;
    int idxNew2;
    Token sCollSeqName;  /* Name of collating sequence */

    pLeft = pExpr->x.pList->a[1].pExpr;
    pStr2 = sqlite3ExprDup(db, pStr1, 0);
    if( !db->mallocFailed ){
      u8 c, *pC;       /* Last character before the first wildcard */
      pC = (u8*)&pStr2->u.zToken[sqlite3Strlen30(pStr2->u.zToken)-1];
      c = *pC;
      if( noCase ){
        /* The point is to increment the last character before the first
        ** wildcard.  But if we increment '@', that will push it into the
        ** alphabetic range where case conversions will mess up the 
        ** inequality.  To avoid this, make sure to also run the full
        ** LIKE on all candidate expressions by clearing the isComplete flag
        */
        if( c=='A'-1 ) isComplete = 0;   /* EV: R-64339-08207 */


        c = sqlite3UpperToLower[c];
      }
      *pC = c + 1;
    }
    sCollSeqName.z = noCase ? "NOCASE" : "BINARY";
    sCollSeqName.n = 6;
    pNewExpr1 = sqlite3ExprDup(db, pLeft, 0);
    pNewExpr1 = sqlite3PExpr(pParse, TK_GE, 
           sqlite3ExprAddCollateToken(pParse,pNewExpr1,&sCollSeqName),
           pStr1, 0);
    idxNew1 = whereClauseInsert(pWC, pNewExpr1, TERM_VIRTUAL|TERM_DYNAMIC);
    testcase( idxNew1==0 );
    exprAnalyze(pSrc, pWC, idxNew1);
    pNewExpr2 = sqlite3ExprDup(db, pLeft, 0);
    pNewExpr2 = sqlite3PExpr(pParse, TK_LT,
           sqlite3ExprAddCollateToken(pParse,pNewExpr2,&sCollSeqName),
           pStr2, 0);
    idxNew2 = whereClauseInsert(pWC, pNewExpr2, TERM_VIRTUAL|TERM_DYNAMIC);
    testcase( idxNew2==0 );
    exprAnalyze(pSrc, pWC, idxNew2);
    pTerm = &pWC->a[idxTerm];
    if( isComplete ){
      pWC->a[idxNew1].iParent = idxTerm;
      pWC->a[idxNew2].iParent = idxTerm;
      pTerm->nChild = 2;
    }
  }
#endif /* SQLITE_OMIT_LIKE_OPTIMIZATION */

#ifndef SQLITE_OMIT_VIRTUALTABLE
  /* Add a WO_MATCH auxiliary term to the constraint set if the
  ** current expression is of the form:  column MATCH expr.
  ** This information is used by the xBestIndex methods of
  ** virtual tables.  The native query optimizer does not attempt
  ** to do anything with MATCH functions.
  */
  if( isMatchOfColumn(pExpr) ){
    int idxNew;
    Expr *pRight, *pLeft;
    WhereTerm *pNewTerm;
    Bitmask prereqColumn, prereqExpr;

    pRight = pExpr->x.pList->a[0].pExpr;
    pLeft = pExpr->x.pList->a[1].pExpr;
    prereqExpr = exprTableUsage(pMaskSet, pRight);
    prereqColumn = exprTableUsage(pMaskSet, pLeft);
    if( (prereqExpr & prereqColumn)==0 ){
      Expr *pNewExpr;
      pNewExpr = sqlite3PExpr(pParse, TK_MATCH, 
                              0, sqlite3ExprDup(db, pRight, 0), 0);
      idxNew = whereClauseInsert(pWC, pNewExpr, TERM_VIRTUAL|TERM_DYNAMIC);
      testcase( idxNew==0 );
      pNewTerm = &pWC->a[idxNew];
      pNewTerm->prereqRight = prereqExpr;
      pNewTerm->leftCursor = pLeft->iTable;
      pNewTerm->u.leftColumn = pLeft->iColumn;
      pNewTerm->eOperator = WO_MATCH;
      pNewTerm->iParent = idxTerm;
      pTerm = &pWC->a[idxTerm];
      pTerm->nChild = 1;
      pTerm->wtFlags |= TERM_COPIED;
      pNewTerm->prereqAll = pTerm->prereqAll;
    }
  }
#endif /* SQLITE_OMIT_VIRTUALTABLE */

#ifdef SQLITE_ENABLE_STAT3
  /* When sqlite_stat3 histogram data is available an operator of the
  ** form "x IS NOT NULL" can sometimes be evaluated more efficiently
  ** as "x>NULL" if x is not an INTEGER PRIMARY KEY.  So construct a
  ** virtual term of that form.
  **
  ** Note that the virtual term must be tagged with TERM_VNULL.  This
  ** TERM_VNULL tag will suppress the not-null check at the beginning
  ** of the loop.  Without the TERM_VNULL flag, the not-null check at
  ** the start of the loop will prevent any results from being returned.
  */
  if( pExpr->op==TK_NOTNULL
   && pExpr->pLeft->op==TK_COLUMN
   && pExpr->pLeft->iColumn>=0
  ){
    Expr *pNewExpr;
    Expr *pLeft = pExpr->pLeft;
    int idxNew;
    WhereTerm *pNewTerm;

    pNewExpr = sqlite3PExpr(pParse, TK_GT,
                            sqlite3ExprDup(db, pLeft, 0),
                            sqlite3PExpr(pParse, TK_NULL, 0, 0, 0), 0);

    idxNew = whereClauseInsert(pWC, pNewExpr,
                              TERM_VIRTUAL|TERM_DYNAMIC|TERM_VNULL);
    if( idxNew ){
      pNewTerm = &pWC->a[idxNew];
      pNewTerm->prereqRight = 0;
      pNewTerm->leftCursor = pLeft->iTable;
      pNewTerm->u.leftColumn = pLeft->iColumn;
      pNewTerm->eOperator = WO_GT;
      pNewTerm->iParent = idxTerm;
      pTerm = &pWC->a[idxTerm];
      pTerm->nChild = 1;
      pTerm->wtFlags |= TERM_COPIED;
      pNewTerm->prereqAll = pTerm->prereqAll;
    }
  }
#endif /* SQLITE_ENABLE_STAT */

  /* Prevent ON clause terms of a LEFT JOIN from being used to drive
  ** an index for tables to the left of the join.
  */
  pTerm->prereqRight |= extraRight;
}